

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

int ipc_helper_send_zero(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char *local_30;
  undefined1 local_28 [8];
  uv_buf_t zero_buf;
  int r;
  
  uVar3 = uv_buf_init((char *)0x0,0);
  eval_a = (int64_t)uVar3.base;
  local_28 = (undefined1  [8])eval_a;
  local_30 = (char *)uVar3.len;
  zero_buf.base = local_30;
  puVar2 = uv_default_loop();
  zero_buf.len._4_4_ = uv_pipe_init(puVar2,&channel,0);
  if ((long)zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x345,"r","==","0",(long)zero_buf.len._4_4_,"==",0);
    abort();
  }
  uv_pipe_open(&channel,0);
  iVar1 = uv_is_readable((uv_stream_t *)&channel);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x349,"1","==","uv_is_readable((uv_stream_t*) &channel)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)&channel);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x34a,"1","==","uv_is_writable((uv_stream_t*) &channel)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&channel);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x34b,"uv_is_closing((uv_handle_t*) &channel)","==","0",(long)iVar1,"==",0);
    abort();
  }
  zero_buf.len._4_4_ =
       uv_write(&write_req,(uv_stream_t *)&channel,(uv_buf_t *)local_28,1,send_zero_write_cb);
  if ((long)zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x353,"r","==","0",(long)zero_buf.len._4_4_,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  zero_buf.len._4_4_ = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)zero_buf.len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x356,"r","==","0",(long)zero_buf.len._4_4_,"==",0);
    abort();
  }
  if ((long)send_zero_write != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x358,"1","==","send_zero_write",1,"==",(long)send_zero_write);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
            ,0x35a,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT_OK(r);

  uv_pipe_open(&channel, UV_STDIN_FD);

  ASSERT_EQ(1, uv_is_readable((uv_stream_t*) &channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*) &channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, send_zero_write);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}